

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O3

bool __thiscall
QStyledItemDelegate::editorEvent
          (QStyledItemDelegate *this,QEvent *event,QAbstractItemModel *model,
          QStyleOptionViewItem *option,QModelIndex *index)

{
  QAbstractItemModel *pQVar1;
  QWidget *this_00;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  char cVar5;
  undefined1 uVar6;
  uint uVar7;
  CheckState CVar8;
  QStyle *pQVar9;
  int iVar10;
  long in_FS_OFFSET;
  bool bVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  QStyleOptionViewItem viewOpt;
  undefined8 local_140;
  undefined1 local_138 [16];
  QStyleOptionViewItem local_128;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = (**(code **)(*(long *)model + 0x138))(model,index);
  auVar3._8_8_ = local_138._8_8_;
  auVar3._0_8_ = local_138._0_8_;
  auVar14._8_8_ = local_138._8_8_;
  auVar14._0_8_ = local_138._0_8_;
  if ((uVar7 & 0x10) == 0) {
    uVar6 = 0;
    goto LAB_0055f0f7;
  }
  uVar6 = 0;
  local_138 = auVar14;
  if (((uVar7 & 0x20) == 0) ||
     (local_138 = auVar3,
     ((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i & 1) == 0)) goto LAB_0055f0f7;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (index->m).ptr;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = (undefined1 *)0x0;
    local_58._16_8_ = (undefined1 *)0x0;
    puStack_40 = (undefined1 *)0x2;
LAB_0055f0e7:
    uVar6 = 0;
  }
  else {
    (**(code **)(*(long *)pQVar1 + 0x90))(&local_58,pQVar1,index,10);
    if (puStack_40 < (undefined1 *)0x4) goto LAB_0055f0e7;
    this_00 = option->widget;
    if (this_00 == (QWidget *)0x0) {
      pQVar9 = QApplication::style();
    }
    else {
      pQVar9 = QWidget::style(this_00);
    }
    auVar4._8_8_ = local_138._8_8_;
    auVar4._0_8_ = local_138._0_8_;
    if (*(ushort *)(event + 8) - 2 < 3) {
      memset(&local_128,0xaa,0xd0);
      QStyleOptionViewItem::QStyleOptionViewItem(&local_128,option);
      (**(code **)(*(long *)this + 0xb8))(this,&local_128,index);
      local_138 = (**(code **)(*(long *)pQVar9 + 0xc0))(pQVar9,0x17,&local_128,this_00);
      if (*(int *)(event + 0x40) == 1) {
        auVar14 = QEventPoint::position();
        dVar13 = (double)((ulong)auVar14._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar14._0_8_;
        bVar11 = 2147483647.0 < dVar13;
        if (dVar13 <= -2147483648.0) {
          dVar13 = -2147483648.0;
        }
        dVar12 = (double)((ulong)auVar14._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar14._8_8_;
        bVar2 = 2147483647.0 < dVar12;
        if (dVar12 <= -2147483648.0) {
          dVar12 = -2147483648.0;
        }
        local_140 = CONCAT44((int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 |
                                          ~-(ulong)bVar2 & (ulong)dVar12),
                             (int)(double)(-(ulong)bVar11 & 0x41dfffffffc00000 |
                                          ~-(ulong)bVar11 & (ulong)dVar13));
        bVar11 = false;
        cVar5 = QRect::contains((QPoint *)local_138,SUB81(&local_140,0));
        uVar6 = 0;
        if (cVar5 != '\0') {
          bVar11 = (*(int *)(event + 8) - 2U & 0xfffd) != 0;
          uVar6 = 1;
        }
      }
      else {
        bVar11 = false;
        uVar6 = 0;
      }
      QBrush::~QBrush(&local_128.backgroundBrush);
      if (&(local_128.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_128.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_128.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_128.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate(&(local_128.text.d.d)->super_QArrayData,2,0x10);
        }
      }
      QIcon::~QIcon(&local_128.icon);
      QLocale::~QLocale(&local_128.locale);
      QFont::~QFont(&local_128.font);
      QStyleOption::~QStyleOption(&local_128.super_QStyleOption);
      if (bVar11) goto LAB_0055f30b;
    }
    else {
      if ((*(ushort *)(event + 8) != 6) ||
         ((*(int *)(event + 0x40) != 0x1010000 &&
          (local_138 = auVar4, *(int *)(event + 0x40) != 0x20)))) goto LAB_0055f0e7;
LAB_0055f30b:
      CVar8 = QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>((QVariant *)&local_58);
      if ((uVar7 >> 8 & 1) == 0) {
        iVar10 = (uint)(CVar8 != Checked) * 2;
      }
      else {
        iVar10 = (int)(CVar8 + PartiallyChecked) % 3;
      }
      ::QVariant::QVariant((QVariant *)&local_128,iVar10);
      uVar6 = (**(code **)(*(long *)model + 0x98))(model,index,&local_128,10);
      ::QVariant::~QVariant((QVariant *)&local_128);
    }
  }
  ::QVariant::~QVariant((QVariant *)&local_58);
LAB_0055f0f7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)uVar6;
}

Assistant:

bool QStyledItemDelegate::editorEvent(QEvent *event,
                                QAbstractItemModel *model,
                                const QStyleOptionViewItem &option,
                                const QModelIndex &index)
{
    Q_ASSERT(event);
    Q_ASSERT(model);

    // make sure that the item is checkable
    Qt::ItemFlags flags = model->flags(index);
    if (!(flags & Qt::ItemIsUserCheckable) || !(option.state & QStyle::State_Enabled)
        || !(flags & Qt::ItemIsEnabled))
        return false;

    // make sure that we have a check state
    QVariant value = index.data(Qt::CheckStateRole);
    if (!value.isValid())
        return false;

    const QWidget *widget = QStyledItemDelegatePrivate::widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();

    // make sure that we have the right event type
    if ((event->type() == QEvent::MouseButtonRelease)
        || (event->type() == QEvent::MouseButtonDblClick)
        || (event->type() == QEvent::MouseButtonPress)) {
        QStyleOptionViewItem viewOpt(option);
        initStyleOption(&viewOpt, index);
        QRect checkRect = style->subElementRect(QStyle::SE_ItemViewItemCheckIndicator, &viewOpt, widget);
        QMouseEvent *me = static_cast<QMouseEvent*>(event);
        if (me->button() != Qt::LeftButton || !checkRect.contains(me->position().toPoint()))
            return false;

        if ((event->type() == QEvent::MouseButtonPress)
            || (event->type() == QEvent::MouseButtonDblClick))
            return true;

    } else if (event->type() == QEvent::KeyPress) {
        if (static_cast<QKeyEvent*>(event)->key() != Qt::Key_Space
         && static_cast<QKeyEvent*>(event)->key() != Qt::Key_Select)
            return false;
    } else {
        return false;
    }

    Qt::CheckState state = QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>(value);
    if (flags & Qt::ItemIsUserTristate)
        state = ((Qt::CheckState)((state + 1) % 3));
    else
        state = (state == Qt::Checked) ? Qt::Unchecked : Qt::Checked;
    return model->setData(index, state, Qt::CheckStateRole);
}